

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::CharReaderBuilder::validate(CharReaderBuilder *this,Value *invalid)

{
  key_type *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *key;
  _Alloc_hider _Var2;
  ArrayIndex AVar3;
  iterator iVar4;
  Value *pVVar5;
  Value *this_00;
  long lVar6;
  long lVar7;
  bool bVar8;
  Members keys;
  size_type __dnew;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid_keys;
  Value my_invalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pointer local_a0;
  Value *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  Value *local_60;
  Value local_58;
  
  local_58.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
        )(__uniq_ptr_data<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>,_true,_true>
          )0x0;
  Value::initBasic(&local_58,nullValue,false);
  local_98 = invalid;
  if (invalid == (Value *)0x0) {
    local_98 = &local_58;
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_90);
  paVar1 = &local_c0.field_2;
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x656c6c6f63;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x7463;
  local_c0.field_2._M_local_buf[7] = 'C';
  local_c0.field_2._8_2_ = 0x6d6f;
  local_c0.field_2._M_local_buf[10] = 'm';
  local_c0.field_2._M_local_buf[0xb] = 'e';
  local_c0.field_2._M_local_buf[0xc] = 'n';
  local_c0.field_2._M_local_buf[0xd] = 't';
  local_c0.field_2._M_local_buf[0xe] = 's';
  local_c0._M_string_length = 0xf;
  local_c0.field_2._M_local_buf[0xf] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x776f6c6c61;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x6f43;
  local_c0.field_2._M_local_buf[7] = 'm';
  local_c0.field_2._8_2_ = 0x656d;
  local_c0.field_2._M_local_buf[10] = 'n';
  local_c0.field_2._M_local_buf[0xb] = 't';
  local_c0.field_2._M_local_buf[0xc] = 's';
  local_c0._M_string_length = 0xd;
  local_c0.field_2._M_local_buf[0xd] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x13;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"allowTrailingCommas",0x13);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x6369727473;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x5274;
  local_c0.field_2._M_local_buf[7] = 'o';
  local_c0.field_2._8_2_ = 0x746f;
  local_c0._M_string_length = 10;
  local_c0.field_2._M_local_buf[10] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x1c;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"allowDroppedNullPlaceholders",0x1c);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x10;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"allowNumericKeys",0x10);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x11;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"allowSingleQuotes",0x11);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x6b63617473;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_c0.field_2._M_local_buf[7] = 'm';
  local_c0.field_2._8_2_ = 0x7469;
  local_c0._M_string_length = 10;
  local_c0.field_2._M_local_buf[10] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x496c696166;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x4566;
  local_c0.field_2._M_local_buf[7] = 'x';
  local_c0.field_2._8_2_ = 0x7274;
  local_c0.field_2._M_local_buf[10] = 'a';
  local_c0._M_string_length = 0xb;
  local_c0.field_2._M_local_buf[0xb] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_c0.field_2._M_allocated_capacity._0_5_ = 0x63656a6572;
  local_c0.field_2._M_allocated_capacity._5_2_ = 0x4474;
  local_c0.field_2._M_local_buf[7] = 'u';
  local_c0.field_2._8_2_ = 0x4b70;
  local_c0.field_2._M_local_buf[10] = 'e';
  local_c0.field_2._M_local_buf[0xb] = 'y';
  local_c0.field_2._M_local_buf[0xc] = 's';
  local_c0._M_string_length = 0xd;
  local_c0.field_2._M_local_buf[0xd] = '\0';
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_a0 = (pointer)0x12;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_c0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_c0,(ulong)&local_a0);
  local_c0.field_2._M_allocated_capacity._0_5_ = SUB85(local_a0,0);
  local_c0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)local_a0 >> 0x28);
  local_c0.field_2._M_local_buf[7] = (char)((ulong)local_a0 >> 0x38);
  builtin_strncpy(local_c0._M_dataplus._M_p,"allowSpecialFloats",0x12);
  local_c0._M_string_length = (size_type)local_a0;
  local_c0._M_dataplus._M_p[(long)local_a0] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_90,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT17(local_c0.field_2._M_local_buf[7],
                             CONCAT25(local_c0.field_2._M_allocated_capacity._5_2_,
                                      local_c0.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_60 = invalid;
  Value::getMemberNames_abi_cxx11_((Members *)&local_c0,&this->settings_);
  if (local_c0._M_string_length - (long)local_c0._M_dataplus._M_p != 0) {
    lVar7 = (long)(local_c0._M_string_length - (long)local_c0._M_dataplus._M_p) >> 5;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar6 = 0;
    do {
      _Var2._M_p = local_c0._M_dataplus._M_p;
      __k = (key_type *)(local_c0._M_dataplus._M_p + lVar6);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_90,__k);
      if ((_Rb_tree_header *)iVar4._M_node == &local_90._M_impl.super__Rb_tree_header) {
        pVVar5 = Value::operator[](&this->settings_,__k);
        key = *(char **)(_Var2._M_p + lVar6);
        this_00 = Value::resolveReference(local_98,key,key + *(long *)(_Var2._M_p + lVar6 + 8));
        Value::operator=(this_00,pVVar5);
      }
      lVar6 = lVar6 + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pVVar5 = &local_58;
  if (local_60 != (Value *)0x0) {
    pVVar5 = local_60;
  }
  bVar8 = false;
  if ((*(byte *)&pVVar5->bits_ < 8) &&
     (bVar8 = false, (0xc1U >> (*(byte *)&pVVar5->bits_ & 0x1f) & 1) != 0)) {
    AVar3 = Value::size(local_98);
    bVar8 = AVar3 == 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  Value::~Value(&local_58);
  return bVar8;
}

Assistant:

bool CharReaderBuilder::validate(Json::Value* invalid) const {
  Json::Value my_invalid;
  if (!invalid)
    invalid = &my_invalid; // so we do not need to test for NULL
  Json::Value& inv = *invalid;
  std::set<String> valid_keys;
  getValidReaderKeys(&valid_keys);
  Value::Members keys = settings_.getMemberNames();
  size_t n = keys.size();
  for (size_t i = 0; i < n; ++i) {
    String const& key = keys[i];
    if (valid_keys.find(key) == valid_keys.end()) {
      inv[key] = settings_[key];
    }
  }
  return inv.empty();
}